

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FinishTrigger(Parse *pParse,TriggerStep *pStepList,Token *pAll)

{
  char *pKey;
  undefined4 iDb_00;
  int iVar1;
  Vdbe *p;
  char *pcVar2;
  Trigger *pTVar3;
  void *pvVar4;
  Table *pTab;
  Hash *pHash;
  Trigger *pLink;
  char *z;
  Vdbe *v;
  Token nameToken;
  undefined1 local_68 [4];
  int iDb;
  DbFixer sFix;
  sqlite3 *db;
  char *zName;
  Trigger *pTrig;
  Token *pAll_local;
  TriggerStep *pStepList_local;
  Parse *pParse_local;
  
  zName = (char *)pParse->pNewTrigger;
  sFix.pName = (Token *)pParse->db;
  pParse->pNewTrigger = (Trigger *)0x0;
  pTVar3 = (Trigger *)zName;
  pAll_local = (Token *)pStepList;
  if ((pParse->nErr == 0) && ((Trigger *)zName != (Trigger *)0x0)) {
    pKey = ((Trigger *)zName)->zName;
    nameToken._12_4_ = sqlite3SchemaToIndex(pParse->db,((Trigger *)zName)->pSchema);
    ((Trigger *)zName)->step_list = pStepList;
    for (; pAll_local != (Token *)0x0; pAll_local = *(Token **)&pAll_local[4].n) {
      *(char **)&pAll_local->n = zName;
    }
    sqlite3TokenInit((Token *)&v,((Trigger *)zName)->zName);
    sqlite3FixInit((DbFixer *)local_68,pParse,nameToken._12_4_,"trigger",(Token *)&v);
    iVar1 = sqlite3FixTriggerStep((DbFixer *)local_68,((Trigger *)zName)->step_list);
    if ((iVar1 == 0) &&
       (iVar1 = sqlite3FixExpr((DbFixer *)local_68,((Trigger *)zName)->pWhen), iVar1 == 0)) {
      if (pParse->eParseMode < 2) {
        if (*(char *)((long)&sFix.pName[0xb].z + 5) == '\0') {
          p = sqlite3GetVdbe(pParse);
          if (p == (Vdbe *)0x0) goto LAB_001a912c;
          sqlite3BeginWriteOperation(pParse,0,nameToken._12_4_);
          pcVar2 = sqlite3DbStrNDup((sqlite3 *)sFix.pName,pAll->z,(ulong)pAll->n);
          sqlite3NestedParse(pParse,
                             "INSERT INTO %Q.%s VALUES(\'trigger\',%Q,%Q,0,\'CREATE TRIGGER %q\')",
                             *(undefined8 *)(sFix.pName[2].z + (long)(int)nameToken._12_4_ * 0x20),
                             "sqlite_master",pKey,((Trigger *)zName)->table,pcVar2);
          sqlite3DbFree((sqlite3 *)sFix.pName,pcVar2);
          sqlite3ChangeCookie(pParse,nameToken._12_4_);
          iDb_00 = nameToken._12_4_;
          pcVar2 = sqlite3MPrintf((sqlite3 *)sFix.pName,"type=\'trigger\' AND name=\'%q\'",pKey);
          sqlite3VdbeAddParseSchemaOp(p,iDb_00,pcVar2);
        }
      }
      else {
        pParse->pNewTrigger = (Trigger *)zName;
        zName = (char *)0x0;
      }
      pTVar3 = (Trigger *)zName;
      if (*(char *)((long)&sFix.pName[0xb].z + 5) != '\0') {
        pTVar3 = (Trigger *)
                 sqlite3HashInsert((Hash *)(*(long *)(sFix.pName[2].z +
                                                     (long)(int)nameToken._12_4_ * 0x20 + 0x18) +
                                           0x38),pKey,zName);
        if (pTVar3 == (Trigger *)0x0) {
          if (*(long *)(zName + 0x28) == *(long *)(zName + 0x30)) {
            pvVar4 = sqlite3HashFind((Hash *)(*(long *)(zName + 0x30) + 8),*(char **)(zName + 8));
            *(undefined8 *)(zName + 0x40) = *(undefined8 *)((long)pvVar4 + 0x68);
            *(char **)((long)pvVar4 + 0x68) = zName;
          }
        }
        else {
          sqlite3OomFault((sqlite3 *)sFix.pName);
        }
      }
    }
  }
LAB_001a912c:
  zName = (char *)pTVar3;
  sqlite3DeleteTrigger((sqlite3 *)sFix.pName,(Trigger *)zName);
  sqlite3DeleteTriggerStep((sqlite3 *)sFix.pName,(TriggerStep *)pAll_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishTrigger(
  Parse *pParse,          /* Parser context */
  TriggerStep *pStepList, /* The triggered program */
  Token *pAll             /* Token that describes the complete CREATE TRIGGER */
){
  Trigger *pTrig = pParse->pNewTrigger;   /* Trigger being finished */
  char *zName;                            /* Name of trigger */
  sqlite3 *db = pParse->db;               /* The database */
  DbFixer sFix;                           /* Fixer object */
  int iDb;                                /* Database containing the trigger */
  Token nameToken;                        /* Trigger name for error reporting */

  pParse->pNewTrigger = 0;
  if( NEVER(pParse->nErr) || !pTrig ) goto triggerfinish_cleanup;
  zName = pTrig->zName;
  iDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
  pTrig->step_list = pStepList;
  while( pStepList ){
    pStepList->pTrig = pTrig;
    pStepList = pStepList->pNext;
  }
  sqlite3TokenInit(&nameToken, pTrig->zName);
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", &nameToken);
  if( sqlite3FixTriggerStep(&sFix, pTrig->step_list) 
   || sqlite3FixExpr(&sFix, pTrig->pWhen) 
  ){
    goto triggerfinish_cleanup;
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( IN_RENAME_OBJECT ){
    assert( !db->init.busy );
    pParse->pNewTrigger = pTrig;
    pTrig = 0;
  }else
#endif

  /* if we are not initializing,
  ** build the sqlite_master entry
  */
  if( !db->init.busy ){
    Vdbe *v;
    char *z;

    /* Make an entry in the sqlite_master table */
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto triggerfinish_cleanup;
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    z = sqlite3DbStrNDup(db, (char*)pAll->z, pAll->n);
    testcase( z==0 );
    sqlite3NestedParse(pParse,
       "INSERT INTO %Q.%s VALUES('trigger',%Q,%Q,0,'CREATE TRIGGER %q')",
       db->aDb[iDb].zDbSName, MASTER_NAME, zName,
       pTrig->table, z);
    sqlite3DbFree(db, z);
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddParseSchemaOp(v, iDb,
        sqlite3MPrintf(db, "type='trigger' AND name='%q'", zName));
  }

  if( db->init.busy ){
    Trigger *pLink = pTrig;
    Hash *pHash = &db->aDb[iDb].pSchema->trigHash;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTrig = sqlite3HashInsert(pHash, zName, pTrig);
    if( pTrig ){
      sqlite3OomFault(db);
    }else if( pLink->pSchema==pLink->pTabSchema ){
      Table *pTab;
      pTab = sqlite3HashFind(&pLink->pTabSchema->tblHash, pLink->table);
      assert( pTab!=0 );
      pLink->pNext = pTab->pTrigger;
      pTab->pTrigger = pLink;
    }
  }

triggerfinish_cleanup:
  sqlite3DeleteTrigger(db, pTrig);
  assert( IN_RENAME_OBJECT || !pParse->pNewTrigger );
  sqlite3DeleteTriggerStep(db, pStepList);
}